

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O3

int aura_core_start_call
              (aura_node *node,aura_object *o,
              _func_void_aura_node_ptr_int_aura_buffer_ptr_void_ptr *calldonecb,void *arg,
              aura_buffer *buf)

{
  list_head *plVar1;
  int iVar2;
  
  aura_node_eventloop_get_autocreate(node);
  if (o == (aura_object *)0x0) {
    iVar2 = -0x39;
  }
  else {
    iVar2 = -8;
    if ((node->status == AURA_STATUS_ONLINE) && (iVar2 = -5, o->pending == 0)) {
      o->calldonecb = calldonecb;
      o->arg = arg;
      buf->object = o;
      o->pending = 1;
      plVar1 = (node->outbound_buffers).next;
      aura_queue_buffer(&node->outbound_buffers,buf);
      iVar2 = 0;
      if (plVar1 == &node->outbound_buffers) {
        iVar2 = 0;
        (*node->tr->handle_event)(node,NODE_EVENT_HAVE_OUTBOUND,(aura_pollfds *)0x0);
      }
    }
  }
  return iVar2;
}

Assistant:

int aura_core_start_call(struct aura_node *node,
			 struct aura_object *o,
			 void (*calldonecb)(struct aura_node *dev, int status, struct aura_buffer *ret, void *arg),
			 void *arg,
			 struct aura_buffer *buf)
{
	struct aura_eventloop *loop = aura_node_eventloop_get_autocreate(node);

	if (!o)
		return -EBADSLT;

	if (node->status != AURA_STATUS_ONLINE)
		return -ENOEXEC;

	if (o->pending)
		return -EIO;

	if (!loop)
		BUG(node, "Node has no assosiated event system. Fix your code!");

	o->calldonecb = calldonecb;
	o->arg = arg;
	buf->object = o;
	o->pending++;

	bool is_first = list_empty(&node->outbound_buffers);
	aura_queue_buffer(&node->outbound_buffers, buf);
	/* If this is the first buffer queued, notify transport immediately */
	if (is_first)
		node->tr->handle_event(node, NODE_EVENT_HAVE_OUTBOUND, NULL);

	return 0;
}